

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::
     TryConvertFacevaryingToVertexFloat<std::array<tinyusdz::value::half,4ul>,float>
               (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                *src,vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     *dst,vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               float eps)

{
  uint uVar1;
  pointer puVar2;
  _Hash_node_base *p_Var3;
  pointer paVar4;
  bool bVar5;
  pointer puVar6;
  mapped_type *pmVar7;
  __node_base _Var8;
  __hash_code __code;
  ulong uVar9;
  uint uVar10;
  size_type __new_size;
  uint32_t vidx;
  unordered_map<unsigned_int,_std::array<tinyusdz::value::half,_4UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>_>
  vdata;
  uint local_70;
  float local_6c;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (dst == (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
              *)0x0) {
    bVar5 = false;
  }
  else {
    puVar6 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = (long)puVar2 - (long)puVar6 >> 2;
    bVar5 = false;
    if (((long)(src->
               super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(src->
               super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start >> 3 == uVar9) && (2 < uVar9)) {
      local_68._M_buckets = &local_68._M_single_bucket;
      local_68._M_bucket_count = 1;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = 0;
      local_68._M_rehash_policy._M_max_load_factor = 1.0;
      local_68._M_rehash_policy._M_next_resize = 0;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      local_6c = eps;
      if (puVar2 == puVar6) {
        __new_size = 1;
      }
      else {
        uVar9 = 0;
        uVar10 = 0;
        do {
          local_70 = puVar6[uVar9];
          if (uVar10 < local_70) {
            uVar10 = local_70;
          }
          if (local_68._M_buckets[(ulong)local_70 % local_68._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var3 = local_68._M_buckets[(ulong)local_70 % local_68._M_bucket_count]->_M_nxt;
            uVar1 = *(uint *)&p_Var3[1]._M_nxt;
            do {
              if (local_70 == uVar1) {
                pmVar7 = ::std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&local_68,&local_70);
                bVar5 = math::is_close(pmVar7,(src->
                                              super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                       local_6c);
                if (bVar5) goto LAB_00377f78;
                bVar5 = false;
                goto LAB_00377fdf;
              }
              p_Var3 = p_Var3->_M_nxt;
            } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                    (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                    (ulong)uVar1 % local_68._M_bucket_count ==
                    (ulong)local_70 % local_68._M_bucket_count));
          }
          paVar4 = (src->
                   super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pmVar7 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,&local_70);
          *(undefined8 *)pmVar7->_M_elems = *(undefined8 *)paVar4[uVar9]._M_elems;
LAB_00377f78:
          uVar9 = uVar9 + 1;
          puVar6 = (faceVertexIndices->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(faceVertexIndices->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >>
                                2));
        __new_size = (size_type)(uVar10 + 1);
      }
      ::std::
      vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
      ::resize(dst,__new_size);
      memset((dst->
             super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start,0,__new_size << 3);
      bVar5 = true;
      for (_Var8._M_nxt = local_68._M_before_begin._M_nxt; _Var8._M_nxt != (_Hash_node_base *)0x0;
          _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt) {
        *(undefined8 *)
         (dst->
         super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
         )._M_impl.super__Vector_impl_data._M_start[*(uint *)&_Var8._M_nxt[1]._M_nxt]._M_elems =
             *(undefined8 *)((long)&_Var8._M_nxt[1]._M_nxt + 4);
      }
LAB_00377fdf:
      ::std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>,_std::allocator<std::pair<const_unsigned_int,_std::array<tinyusdz::value::half,_4UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
    }
  }
  return bVar5;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}